

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O3

void __thiscall
mnf::Manifold::Manifold
          (Manifold *this,Index dimension,Index tangentDimension,Index representationDimension)

{
  long lVar1;
  
  this->super_RefCounter = 0;
  this->super_ValidManifold = 0x677d7257;
  this->_vptr_Manifold = (_func_int **)&PTR__Manifold_001417c8;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->dimension_ = dimension;
  this->tangentDim_ = tangentDimension;
  this->representationDim_ = representationDimension;
  this->lock_ = false;
  if (dimension < 0) {
    __assert_fail("0 <= dimension && \"Negative dimension not accepted\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x21,"mnf::Manifold::Manifold(Index, Index, Index)");
  }
  if (dimension <= tangentDimension) {
    if (tangentDimension <= representationDimension) {
      lVar1 = manifoldCounter_ + 1;
      this->instanceId_ = manifoldCounter_;
      manifoldCounter_ = lVar1;
      return;
    }
    __assert_fail("tangentDimension <= representationDimension",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x23,"mnf::Manifold::Manifold(Index, Index, Index)");
  }
  __assert_fail("dimension <= tangentDimension",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0x22,"mnf::Manifold::Manifold(Index, Index, Index)");
}

Assistant:

Manifold::Manifold(Index dimension, Index tangentDimension,
                   Index representationDimension)
    : dimension_(dimension),
      tangentDim_(tangentDimension),
      representationDim_(representationDimension),
      lock_(false)
{
  mnf_assert(0 <= dimension && "Negative dimension not accepted");
  mnf_assert(dimension <= tangentDimension);
  mnf_assert(tangentDimension <= representationDimension);
  this->instanceId_ = manifoldCounter_++;
}